

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_easy *data;
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  _Bool _Var4;
  uint uVar5;
  CURLcode CVar6;
  time_t tVar7;
  int *piVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  int error;
  int local_a0;
  CURLcode local_9c;
  timeval local_98;
  _Bool *local_88;
  long local_80;
  ulong local_78;
  ulong local_70;
  char ipaddress [46];
  
  data = conn->data;
  error = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
LAB_004afbd1:
    CVar6 = CURLE_OK;
  }
  else {
    local_a0 = sockindex;
    local_98 = curlx_tvnow();
    local_78 = Curl_timeleft(data,&local_98,true);
    if ((long)local_78 < 0) {
      Curl_failf(data,"Connection time-out");
      CVar6 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      local_9c = CURLE_OK;
      local_88 = connected;
      local_80 = (long)sockindex;
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        if (conn->tempsock[lVar11] != -1) {
          uVar5 = Curl_socket_check(-1,-1,conn->tempsock[lVar11],0);
          uVar10 = (ulong)((uint)lVar11 ^ 1);
          if (uVar5 == 2) {
LAB_004afcfa:
            _Var4 = verifyconnect(conn->tempsock[lVar11],&error);
            lVar1 = local_80;
            if (_Var4) {
              conn->sock[local_80] = conn->tempsock[lVar11];
              conn->ip_addr = conn->tempaddr[lVar11];
              conn->tempsock[lVar11] = -1;
              if (conn->tempsock[uVar10] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar10]);
                conn->tempsock[uVar10] = -1;
              }
              CVar6 = Curl_connected_proxy(conn,local_a0);
              if (CVar6 != CURLE_OK) {
                return CVar6;
              }
              (conn->bits).tcpconnect[lVar1] = true;
              *local_88 = true;
              if (local_a0 == 0) {
                Curl_pgrsTime(data,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar1]);
              Curl_verboseconnect(conn);
              goto LAB_004afbd1;
            }
            Curl_infof(data,"Connection failed\n");
          }
          else if (uVar5 == 0) {
            error = 0;
            tVar7 = curlx_tvdiff(local_98,conn->connecttime);
            if (conn->timeoutms_per_addr <= tVar7) {
              Curl_infof(data,"After %ldms connect time, move on!\n");
              error = 0x6e;
            }
            if (((lVar11 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (tVar7 = curlx_tvdiff(local_98,conn->connecttime), 199 < tVar7)) {
              trynextip(conn,local_a0,1);
            }
          }
          else {
            if ((conn->bits).tcp_fastopen == true) goto LAB_004afcfa;
            if ((uVar5 & 4) != 0) {
              verifyconnect(conn->tempsock[lVar11],&error);
            }
          }
          iVar3 = error;
          if (error != 0) {
            (data->state).os_errno = error;
            piVar8 = __errno_location();
            *piVar8 = iVar3;
            if (conn->tempaddr[lVar11] != (Curl_addrinfo *)0x0) {
              local_70 = uVar10;
              Curl_printable_address(conn->tempaddr[lVar11],ipaddress,0x2e);
              lVar1 = conn->port;
              pcVar9 = Curl_strerror(conn,error);
              Curl_infof(data,"connect to %s port %ld failed: %s\n",ipaddress,lVar1,pcVar9);
              conn->timeoutms_per_addr =
                   local_78 >> (conn->tempaddr[lVar11]->ai_next != (Curl_addrinfo *)0x0);
              CVar6 = trynextip(conn,local_a0,(uint)lVar11);
              if ((CVar6 != CURLE_COULDNT_CONNECT) || (conn->tempsock[local_70] == -1)) {
                local_9c = CVar6;
              }
            }
          }
        }
      }
      CVar6 = CURLE_OK;
      if ((local_9c != CURLE_OK) &&
         ((conn->tempaddr[1] != (Curl_addrinfo *)0x0 ||
          (local_9c = trynextip(conn,local_a0,1), local_9c != CURLE_OK)))) {
        lVar11 = 0x120;
        if (((conn->bits).socksproxy == false) &&
           ((lVar11 = 0x160, (conn->bits).httpproxy == false &&
            (lVar11 = 0xd8, (conn->bits).conn_to_host != false)))) {
          lVar11 = 0x100;
        }
        uVar2 = *(undefined8 *)((conn->chunk).hexbuffer + lVar11 + -0x20);
        lVar11 = conn->port;
        pcVar9 = Curl_strerror(conn,error);
        Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar2,lVar11,pcVar9);
        CVar6 = local_9c;
      }
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  time_t allow;
  int error = 0;
  struct timeval now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    const char *hostname;

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
        hostname, conn->port, Curl_strerror(conn, error));
  }

  return result;
}